

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::View<short,_true,_std::allocator<unsigned_long>_>::indexToOffset
          (View<short,_true,_std::allocator<unsigned_long>_> *this,size_t index,size_t *out)

{
  long lVar1;
  long lVar2;
  long lVar3;
  runtime_error *this_00;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  
  testInvariant(this);
  if (index < *(ulong *)(this + 0x30)) {
    testInvariant(this);
    if (this[0x3c] == (View<short,_true,_std::allocator<unsigned_long>_>)0x1) {
      *out = index;
      return;
    }
    *out = 0;
    testInvariant(this);
    if (*(int *)(this + 0x38) == 0) {
      if (*(long *)this == 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      else {
        if (*(long *)(this + 0x28) == 0) {
          return;
        }
        lVar1 = *(long *)(this + 0x18);
        lVar2 = *(long *)(this + 0x20);
        sVar4 = *out;
        uVar6 = 0;
        while( true ) {
          sVar4 = (index / *(ulong *)(lVar1 + uVar6 * 8)) * *(long *)(lVar2 + uVar6 * 8) + sVar4;
          *out = sVar4;
          if (*(ulong *)(this + 0x28) <= uVar6) break;
          index = index % *(ulong *)(lVar1 + uVar6 * 8);
          uVar6 = uVar6 + 1;
          if (*(ulong *)(this + 0x28) <= uVar6) {
            return;
          }
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
    }
    else if (*(long *)this == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      lVar1 = *(long *)(this + 0x28);
      if (lVar1 == 0) {
        if (index == 0) {
          return;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      else {
        lVar2 = *(long *)(this + 0x18);
        lVar3 = *(long *)(this + 0x20);
        sVar4 = (index / *(ulong *)(lVar2 + -8 + lVar1 * 8)) * *(long *)(lVar3 + -8 + lVar1 * 8) +
                *out;
        uVar6 = lVar1 - 1;
        *out = sVar4;
        if (uVar6 < *(ulong *)(this + 0x28)) {
          do {
            uVar5 = uVar6 - 1;
            if (uVar6 == 0) {
              return;
            }
            index = index % *(ulong *)(lVar2 + uVar6 * 8);
            sVar4 = sVar4 + (index / *(ulong *)(lVar2 + uVar5 * 8)) * *(long *)(lVar3 + uVar5 * 8);
            *out = sVar4;
            uVar6 = uVar5;
          } while (uVar5 < *(ulong *)(this + 0x28));
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::indexToOffset
(
    std::size_t index,
    std::size_t& out
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size()); 
    if(isSimple()) {
        out = index;
    }
    else {
        out = 0;
        if(coordinateOrder() == FirstMajorOrder) {
            for(std::size_t j=0; j<this->dimension(); ++j) {
                out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                index = index % geometry_.shapeStrides(j);
            }
        }
        else { // last major order
            if(this->dimension() == 0) {
                marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
                return;
            }
            else {
                std::size_t j = this->dimension()-1;
                for(;;) {
                    out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                    index = index % geometry_.shapeStrides(j);
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
}